

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,ParamList *param_list,void *data)

{
  bool bVar1;
  pointer pSVar2;
  long in_RSI;
  CodeGenerateVisitor *in_RDI;
  NameListData_conflict name_list_data;
  Function *function;
  undefined1 local_21 [17];
  long local_10;
  
  local_10 = in_RSI;
  local_21._1_8_ = GetCurrentFunction(in_RDI);
  Function::AddFixedArgCount((Function *)local_21._1_8_,(int)*(undefined8 *)(local_10 + 0x18));
  if ((*(byte *)(local_10 + 0x10) & 1) != 0) {
    Function::SetHasVararg((Function *)local_21._1_8_);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x20c70f);
  if (bVar1) {
    NameListData::NameListData((NameListData *)local_21,false);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x20c72f);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_21);
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(ParamList *param_list, void *data)
    {
        auto function = GetCurrentFunction();
        function->AddFixedArgCount(param_list->fix_arg_count_);
        if (param_list->vararg_) function->SetHasVararg();

        if (param_list->name_list_)
        {
            NameListData name_list_data{ false };
            param_list->name_list_->Accept(this, &name_list_data);
        }
    }